

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

void jsoncons::jsonpointer::
     replace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,
               basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value,
               bool create_if_missing,error_code *ec)

{
  ulong uVar1;
  bool bVar2;
  reference pbVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  pointer this;
  byte in_CL;
  error_code *in_RDI;
  error_code *in_R8;
  undefined1 auVar7 [16];
  type tVar8;
  pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
  r;
  type result;
  size_t index;
  iterator end;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *current;
  basic_json_pointer<char> *in_stack_fffffffffffffe78;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffe80;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffe88;
  jsonpointer_errc __e;
  error_code *in_stack_fffffffffffffe90;
  error_code *this_00;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  string_view_type *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  error_code *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  string_view_type *in_stack_ffffffffffffff10;
  string_view_type *in_stack_ffffffffffffff18;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff20;
  char *local_a0;
  to_integer_errc local_98;
  ulong local_90;
  undefined4 local_84;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  string local_50 [32];
  error_code *local_30;
  error_code *local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_30 = in_RDI;
  local_28 = in_R8;
  std::__cxx11::string::string(local_50);
  local_58._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       basic_json_pointer<char>::begin_abi_cxx11_(in_stack_fffffffffffffe78);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             basic_json_pointer<char>::end_abi_cxx11_(in_stack_fffffffffffffe78);
  do {
    do {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar2) {
        bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                          (in_stack_fffffffffffffe98);
        if (bVar2) {
          lVar4 = std::__cxx11::string::size();
          if (lVar4 == 1) {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
            if (*pcVar5 == '-') {
              std::error_code::operator=
                        (in_stack_fffffffffffffe90,
                         (jsonpointer_errc)((ulong)in_stack_fffffffffffffe88 >> 0x20));
              local_84 = 1;
              goto LAB_00557e3c;
            }
          }
          local_90 = 0;
          std::__cxx11::string::data();
          std::__cxx11::string::length();
          tVar8 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                            (in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98,
                             (unsigned_long *)in_stack_fffffffffffffe90);
          local_a0 = tVar8.ptr;
          local_98 = tVar8.ec;
          bVar2 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                            ((to_integer_result *)&local_a0);
          uVar1 = local_90;
          if (!bVar2) {
            std::error_code::operator=
                      (in_stack_fffffffffffffe90,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffe88 >> 0x20));
            local_84 = 1;
            goto LAB_00557e3c;
          }
          sVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                            (in_stack_fffffffffffffe88);
          if (sVar6 <= uVar1) {
            std::error_code::operator=
                      (in_stack_fffffffffffffe90,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffe88 >> 0x20));
            local_84 = 1;
            goto LAB_00557e3c;
          }
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                     (size_t)in_stack_ffffffffffffff00);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffe80,
                     (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe78);
        }
        else {
          bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                  is_object(in_stack_fffffffffffffe98);
          __e = (jsonpointer_errc)((ulong)in_stack_fffffffffffffe88 >> 0x20);
          if (!bVar2) {
            std::error_code::operator=(in_stack_fffffffffffffe90,__e);
            local_84 = 1;
            goto LAB_00557e3c;
          }
          this_00 = local_30;
          std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
          bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                  contains((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                           in_stack_fffffffffffffec0);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_ffffffffffffff10);
            this = jsoncons::detail::
                   random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                   ::operator->((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                 *)0x557dfe);
            local_30 = (error_code *)
                       key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       ::value(this);
          }
          else {
            if ((local_19 & 1) == 0) {
              std::error_code::operator=(this_00,__e);
              local_84 = 1;
              goto LAB_00557e3c;
            }
            std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            try_emplace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_ffffffffffffff10);
          }
        }
        local_84 = 0;
        goto LAB_00557e3c;
      }
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_58);
      std::__cxx11::string::operator=(local_50,(string *)pbVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_58);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe78);
    } while (!bVar2);
    auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
    local_80 = auVar7;
    local_30 = (error_code *)
               detail::
               resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          (bool)in_stack_ffffffffffffff0f,in_stack_ffffffffffffff00);
    bVar2 = std::error_code::operator_cast_to_bool(local_28);
  } while (!bVar2);
  local_84 = 1;
LAB_00557e3c:
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void replace(Json& root, 
                 const basic_json_pointer<typename Json::char_type>& location, 
                 T&& value, 
                 bool create_if_missing,
                 std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();

        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, create_if_missing, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return;
            }
            else
            {
                std::size_t index{};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index >= current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                current->at(index) = std::forward<T>(value);
            }
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                if (create_if_missing)
                {
                    current->try_emplace(buffer,std::forward<T>(value));
                }
                else
                {
                    ec = jsonpointer_errc::key_not_found;
                    return;
                }
            }
            else
            {
                auto r = current->insert_or_assign(buffer,std::forward<T>(value));
                current = std::addressof(r.first->value());
            }
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }